

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exp.h
# Opt level: O1

RegEx * YAML::Exp::Anchor(void)

{
  int iVar1;
  RegEx *ex2;
  string local_70;
  RegEx local_50;
  RegEx local_30;
  
  if (Anchor()::e == '\0') {
    iVar1 = __cxa_guard_acquire(&Anchor()::e);
    if (iVar1 != 0) {
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"[]{},","");
      RegEx::RegEx(&local_50,&local_70,REGEX_OR);
      ex2 = BlankOrBreak();
      operator|(&local_30,&local_50,ex2);
      operator!(&Anchor::e,&local_30);
      std::vector<YAML::RegEx,_std::allocator<YAML::RegEx>_>::~vector(&local_30.m_params);
      std::vector<YAML::RegEx,_std::allocator<YAML::RegEx>_>::~vector(&local_50.m_params);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      __cxa_atexit(RegEx::~RegEx,&Anchor::e,&__dso_handle);
      __cxa_guard_release(&Anchor()::e);
    }
  }
  return &Anchor::e;
}

Assistant:

inline const RegEx& Anchor() {
  static const RegEx e = !(RegEx("[]{},", REGEX_OR) | BlankOrBreak());
  return e;
}